

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primepalindrome.cpp
# Opt level: O0

bool isPalindrome(string *pal)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  int local_20;
  int i;
  int length;
  string *pal_local;
  
  iVar2 = std::__cxx11::string::length();
  local_20 = 0;
  while( true ) {
    if (iVar2 / 2 + 1 <= local_20) {
      return true;
    }
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)pal);
    cVar1 = *pcVar3;
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)pal);
    if (cVar1 != *pcVar3) break;
    local_20 = local_20 + 1;
  }
  return false;
}

Assistant:

bool isPalindrome(const string& pal){
    int length = pal.length();
    for(int i=0;i<length/2+1;i++){
        if(pal[i] != pal[length-i-1]){
            return false;
        }
    }

    return true;
}